

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::importRelative(ModuleImpl *this,StringPtr importPath)

{
  String *pSVar1;
  ReadableDirectory *dir;
  size_t in_RCX;
  char *pcVar2;
  StringPtr path;
  PathPtr path_00;
  StringPtr pathText;
  PathPtr path_01;
  Array<kj::String> local_58;
  ArrayPtr<const_kj::String> local_40;
  
  pathText.content.ptr = (char *)importPath.content.size_;
  pcVar2 = importPath.content.ptr;
  if ((in_RCX == 1) || (*pathText.content.ptr != '/')) {
    dir = *(ReadableDirectory **)(pcVar2 + 8);
    pSVar1 = *(String **)(pcVar2 + 0x20);
    local_40 = (ArrayPtr<const_kj::String>)kj::Path::parent((Path *)(pcVar2 + 0x28));
    pathText.content.size_ = in_RCX;
    kj::PathPtr::eval((Path *)&local_58,(PathPtr *)&local_40,pathText);
    path_01.parts.size_ = (size_t)local_58.ptr;
    path_01.parts.ptr = pSVar1;
    Impl::loadModule((Impl *)this,dir,path_01);
  }
  else {
    pSVar1 = *(String **)(pcVar2 + 8);
    path.content.size_ = in_RCX - 1;
    path.content.ptr = pathText.content.ptr + 1;
    kj::Path::parse((Path *)&local_58,path);
    path_00.parts.size_ = (size_t)local_58.ptr;
    path_00.parts.ptr = pSVar1;
    Impl::loadModuleFromSearchPath((Impl *)this,path_00);
  }
  kj::Array<kj::String>::~Array(&local_58);
  return (Maybe<capnp::compiler::Module_&>)&this->super_Module;
}

Assistant:

kj::Maybe<Module&> importRelative(kj::StringPtr importPath) override {
    if (importPath.size() > 0 && importPath[0] == '/') {
      return loader.loadModuleFromSearchPath(kj::Path::parse(importPath.slice(1)));
    } else {
      return loader.loadModule(sourceDir, path.parent().eval(importPath));
    }
  }